

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lyd_print_mem(char **strp,lyd_node *root,LYD_FORMAT format,int options)

{
  LY_ERR *pLVar1;
  undefined1 local_48 [4];
  int r;
  lyout out;
  int options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  char **strp_local;
  
  out.method.mem.size._0_4_ = options;
  out.method.mem.size._4_4_ = format;
  if (strp == (char **)0x0) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
    strp_local._4_4_ = 1;
  }
  else {
    local_48 = (undefined1  [4])0x2;
    out.type = LYOUT_FD;
    out._4_4_ = 0;
    out.method.f = (FILE *)0x0;
    out.method.mem.len = 0;
    strp_local._4_4_ = lyd_print_((lyout *)local_48,root,format,options);
    *strp = (char *)out._0_8_;
  }
  return strp_local._4_4_;
}

Assistant:

API int
lyd_print_mem(char **strp, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    struct lyout out;
    int r;

    if (!strp) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    out.type = LYOUT_MEMORY;
    out.method.mem.buf = NULL;
    out.method.mem.len = 0;
    out.method.mem.size = 0;

    r = lyd_print_(&out, root, format, options);

    *strp = out.method.mem.buf;
    return r;
}